

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_suite.cpp
# Opt level: O0

void parser_suite::parse_null(void)

{
  bool v;
  uchar (*in_RDX) [1];
  undefined1 local_48 [8];
  basic_variable<std::allocator<char>_> result;
  bintoken local_9 [8];
  value_type input [1];
  
  local_9[0] = (bintoken)0x82;
  trial::protocol::bintoken::parse<unsigned_char[1],std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)local_48,local_9,in_RDX);
  v = trial::dynamic::basic_variable<std::allocator<char>_>::same<trial::dynamic::nullable>
                ((basic_variable<std::allocator<char>_> *)local_48);
  boost::detail::test_impl
            ("result.same<nullable>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x25,"void parser_suite::parse_null()",v);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_48);
  return;
}

Assistant:

void parse_null()
{
    const value_type input[] = { bintoken::token::code::null };
    auto result = bintoken::parse(input);
    TRIAL_PROTOCOL_TEST(result.same<nullable>());
}